

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  unsigned_long_long uVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  ImU32 IVar8;
  GetterYs<unsigned_long_long> *pGVar9;
  TransformerLinLog *pTVar10;
  ImPlotPlot *pIVar11;
  GetterYRef *pGVar12;
  ImDrawVert *pIVar13;
  uint *puVar14;
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  pIVar15 = GImPlot;
  pGVar9 = this->Getter1;
  dVar2 = pGVar9->XScale;
  dVar3 = pGVar9->X0;
  pTVar10 = this->Transformer;
  iVar7 = pGVar9->Count;
  uVar4 = *(unsigned_long_long *)
           ((long)pGVar9->Ys +
           (long)(((prim + pGVar9->Offset) % iVar7 + iVar7) % iVar7) * (long)pGVar9->Stride);
  dVar21 = log10((((double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) /
                 GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  pIVar16 = GImPlot;
  iVar7 = pTVar10->YAxis;
  pIVar11 = pIVar15->CurrentPlot;
  dVar5 = pIVar11->YAxis[iVar7].Range.Min;
  fVar22 = (float)(((dVar2 * (double)prim + dVar3) - (pIVar11->XAxis).Range.Min) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar7].Min.x);
  fVar18 = (float)((((double)(float)(dVar21 / pIVar15->LogDenY[iVar7]) *
                     (pIVar11->YAxis[iVar7].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar15->My[iVar7] + (double)pIVar15->PixelRange[iVar7].Min.y);
  pGVar12 = this->Getter2;
  dVar2 = pGVar12->XScale;
  dVar3 = pGVar12->X0;
  pTVar10 = this->Transformer;
  dVar21 = log10(pGVar12->YRef / GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  iVar7 = pTVar10->YAxis;
  pIVar11 = pIVar16->CurrentPlot;
  dVar5 = pIVar11->YAxis[iVar7].Range.Min;
  fVar23 = (float)((((double)prim * dVar2 + dVar3) - (pIVar11->XAxis).Range.Min) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar7].Min.x);
  fVar24 = (float)((((double)(float)(dVar21 / pIVar16->LogDenY[iVar7]) *
                     (pIVar11->YAxis[iVar7].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar16->My[iVar7] + (double)pIVar16->PixelRange[iVar7].Min.y);
  fVar19 = fVar18;
  if (fVar24 <= fVar18) {
    fVar19 = fVar24;
  }
  bVar17 = false;
  if ((fVar19 < (cull_rect->Max).y) &&
     (fVar19 = (float)(~-(uint)(fVar24 <= fVar18) & (uint)fVar24 |
                      -(uint)(fVar24 <= fVar18) & (uint)fVar18), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar19 && fVar19 != *pfVar1)) {
    fVar19 = fVar22;
    if (fVar23 <= fVar22) {
      fVar19 = fVar23;
    }
    bVar17 = false;
    if (fVar19 < (cull_rect->Max).x) {
      fVar19 = (float)(~-(uint)(fVar23 <= fVar22) & (uint)fVar23 |
                      -(uint)(fVar23 <= fVar22) & (uint)fVar22);
      bVar17 = (cull_rect->Min).x <= fVar19 && fVar19 != (cull_rect->Min).x;
    }
  }
  if (bVar17 != false) {
    fVar19 = this->Weight;
    IVar8 = this->Col;
    IVar6 = *uv;
    fVar25 = fVar23 - fVar22;
    fVar26 = fVar24 - fVar18;
    fVar20 = fVar25 * fVar25 + fVar26 * fVar26;
    if (0.0 < fVar20) {
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar25 = fVar25 * (1.0 / fVar20);
      fVar26 = fVar26 * (1.0 / fVar20);
    }
    fVar19 = fVar19 * 0.5;
    fVar25 = fVar25 * fVar19;
    fVar19 = fVar19 * fVar26;
    pIVar13 = DrawList->_VtxWritePtr;
    (pIVar13->pos).x = fVar19 + fVar22;
    (pIVar13->pos).y = fVar18 - fVar25;
    pIVar13->uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar8;
    pIVar13[1].pos.x = fVar19 + fVar23;
    pIVar13[1].pos.y = fVar24 - fVar25;
    pIVar13[1].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar8;
    pIVar13[2].pos.x = fVar23 - fVar19;
    pIVar13[2].pos.y = fVar25 + fVar24;
    pIVar13[2].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar8;
    pIVar13[3].pos.x = fVar22 - fVar19;
    pIVar13[3].pos.y = fVar25 + fVar18;
    pIVar13[3].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    puVar14 = DrawList->_IdxWritePtr;
    *puVar14 = DrawList->_VtxCurrentIdx;
    puVar14[1] = DrawList->_VtxCurrentIdx + 1;
    puVar14[2] = DrawList->_VtxCurrentIdx + 2;
    puVar14[3] = DrawList->_VtxCurrentIdx;
    puVar14[4] = DrawList->_VtxCurrentIdx + 2;
    puVar14[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar14 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return bVar17;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }